

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator.hpp
# Opt level: O3

int __thiscall
boost::unit_test::decorator::fixture_t::clone
          (fixture_t *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  element_type *peVar1;
  fixture_t *p;
  shared_count local_18;
  
  p = (fixture_t *)operator_new(0x18);
  peVar1 = *(element_type **)(__fn + 8);
  local_18.pi_ = *(sp_counted_base **)(__fn + 0x10);
  if (local_18.pi_ == (sp_counted_base *)0x0) {
    (p->super_base)._vptr_base = (_func_int **)&PTR_apply_001c8a38;
    (p->m_impl).px = peVar1;
    (p->m_impl).pn.pi_ = (sp_counted_base *)0x0;
  }
  else {
    LOCK();
    (local_18.pi_)->use_count_ = (local_18.pi_)->use_count_ + 1;
    UNLOCK();
    (p->super_base)._vptr_base = (_func_int **)&PTR_apply_001c8a38;
    (p->m_impl).px = peVar1;
    (p->m_impl).pn.pi_ = local_18.pi_;
    LOCK();
    (local_18.pi_)->use_count_ = (local_18.pi_)->use_count_ + 1;
    UNLOCK();
  }
  shared_ptr<boost::unit_test::decorator::base>::shared_ptr<boost::unit_test::decorator::fixture_t>
            ((shared_ptr<boost::unit_test::decorator::base> *)this,p);
  detail::shared_count::~shared_count(&local_18);
  return (int)this;
}

Assistant:

virtual base_ptr        clone() const { return base_ptr(new fixture_t( m_impl )); }